

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O0

UBool __thiscall icu_63::ResourceDataValue::isNoInheritanceMarker(ResourceDataValue *this)

{
  UBool UVar1;
  ResourceDataValue *this_local;
  
  UVar1 = anon_unknown.dwarf_2a56d0::isNoInheritanceMarker(this->pResData,this->res);
  return UVar1;
}

Assistant:

UBool ResourceDataValue::isNoInheritanceMarker() const {
    return ::isNoInheritanceMarker(pResData, res);
}